

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O1

int LSRKStepSetSSPMethod(void *arkode_mem,ARKODE_LSRKMethodType method)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem local_20;
  ARKodeLSRKStepMem local_18;
  
  iVar1 = lsrkStep_AccessARKODEStepMem(arkode_mem,"LSRKStepSetSSPMethod",&local_20,&local_18);
  if (iVar1 != 0) {
    return iVar1;
  }
  switch(method) {
  case ARKODE_LSRK_RKC_2:
  case ARKODE_LSRK_RKL_2:
    arkProcessError(local_20,-0x16,0x68,"LSRKStepSetSSPMethod",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                    ,"Invalid method option: Call LSRKStepCreateSTS to create an STS method first.")
    ;
    goto LAB_0014800e;
  case ARKODE_LSRK_SSP_S_2:
    local_20->step = lsrkStep_TakeStepSSPs2;
    iVar1 = 1;
    local_18->is_SSP = 1;
    local_18->req_stages = 10;
    local_18->nfusedopvecs = 3;
    pAVar2 = local_20->hadapt_mem;
    iVar3 = 2;
    break;
  case ARKODE_LSRK_SSP_S_3:
    local_20->step = lsrkStep_TakeStepSSPs3;
    local_18->is_SSP = 1;
    local_18->req_stages = 9;
    local_18->nfusedopvecs = 3;
    pAVar2 = local_20->hadapt_mem;
    pAVar2->q = 3;
    local_18->q = 3;
    iVar1 = 2;
    goto LAB_00148008;
  case ARKODE_LSRK_SSP_10_4:
    local_20->step = lsrkStep_TakeStepSSP104;
    local_18->is_SSP = 1;
    local_18->req_stages = 10;
    iVar1 = 3;
    local_18->nfusedopvecs = 3;
    pAVar2 = local_20->hadapt_mem;
    iVar3 = 4;
    break;
  default:
    arkProcessError(local_20,-0x16,0x85,"LSRKStepSetSSPMethod",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                    ,"Invalid method option.");
    return -0x16;
  }
  pAVar2->q = iVar3;
  local_18->q = iVar3;
LAB_00148008:
  pAVar2->p = iVar1;
  local_18->p = iVar1;
LAB_0014800e:
  local_18->LSRKmethod = method;
  return 0;
}

Assistant:

int LSRKStepSetSSPMethod(void* arkode_mem, ARKODE_LSRKMethodType method)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  switch (method)
  {
  case ARKODE_LSRK_RKC_2:
  case ARKODE_LSRK_RKL_2:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Invalid method option: Call LSRKStepCreateSTS to create an STS method first.");
    break;
  case ARKODE_LSRK_SSP_S_2:
    ark_mem->step          = lsrkStep_TakeStepSSPs2;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 10;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 2;
    step_mem->p = ark_mem->hadapt_mem->p = 1;
    break;
  case ARKODE_LSRK_SSP_S_3:
    ark_mem->step          = lsrkStep_TakeStepSSPs3;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 9;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 3;
    step_mem->p = ark_mem->hadapt_mem->p = 2;
    break;
  case ARKODE_LSRK_SSP_10_4:
    ark_mem->step          = lsrkStep_TakeStepSSP104;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 10;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 4;
    step_mem->p = ark_mem->hadapt_mem->p = 3;
    break;

  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid method option.");
    return ARK_ILL_INPUT;
  }

  step_mem->LSRKmethod = method;

  return ARK_SUCCESS;
}